

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
     ::doStartLoop(SpillPointers *self,Expression **currp)

{
  LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *this;
  BasicBlock **__args;
  pointer *pppBVar1;
  BasicBlock *__from;
  iterator iVar2;
  BasicBlock *__to;
  
  this = &(self->
          super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
          ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>;
  __args = &(self->
            super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
            ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
            .currBasicBlock;
  __from = (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
           ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
           super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
           .currBasicBlock;
  startBasicBlock(&this->
                   super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                 );
  iVar2._M_current =
       *(pointer *)
        ((long)&(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                .
                super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                .loopTops.
                super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&(self->
               super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
               ).
               super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
               .loopTops.
               super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
    ::
    _M_realloc_insert<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const&>
              ((vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
                *)&(self->
                   super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                   ).
                   super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                   .
                   super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                   .loopTops,iVar2,__args);
    __to = (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
           ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
           super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
           .currBasicBlock;
  }
  else {
    __to = (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
           ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
           super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
           .currBasicBlock;
    *iVar2._M_current = __to;
    pppBVar1 = (pointer *)
               ((long)&(self->
                       super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                       ).
                       super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                       .
                       super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                       .loopTops.
                       super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    *pppBVar1 = *pppBVar1 + 1;
  }
  link(&this->
        super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
       ,(char *)__from,(char *)__to);
  iVar2._M_current =
       *(pointer *)
        ((long)&(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                .
                super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                .loopLastBlockStack.
                super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current !=
      *(pointer *)
       ((long)&(self->
               super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
               ).
               super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
               .loopLastBlockStack.
               super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    *iVar2._M_current =
         (self->
         super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
         ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
         super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
         .currBasicBlock;
    pppBVar1 = (pointer *)
               ((long)&(self->
                       super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                       ).
                       super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                       .
                       super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                       .loopLastBlockStack.
                       super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    *pppBVar1 = *pppBVar1 + 1;
    return;
  }
  std::
  vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
  ::
  _M_realloc_insert<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const&>
            ((vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
              *)&(self->
                 super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                 ).
                 super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                 .
                 super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                 .loopLastBlockStack,iVar2,__args);
  return;
}

Assistant:

static void doStartLoop(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    // a loop with no backedges would still be counted here, but oh well
    self->loopTops.push_back(self->currBasicBlock);
    self->link(last, self->currBasicBlock);
    self->loopLastBlockStack.push_back(self->currBasicBlock);
  }